

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void do_paint(Terminal *term)

{
  ulong battr;
  ulong bchr;
  ulong uVar1;
  termchar *ptVar2;
  pos p2;
  pos p1;
  pos p2_00;
  pos p1_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  unsigned_long uVar6;
  _Bool _Var7;
  wchar_t scr_y;
  uint uVar8;
  wchar_t wVar9;
  void *ptr;
  termline *ptVar10;
  termchar *ptVar11;
  bool bVar12;
  bool bVar13;
  ulong local_128;
  ulong local_120;
  _Bool local_112;
  _Bool local_111;
  wchar_t local_104;
  wchar_t local_100;
  unsigned_long schar;
  termchar *dd;
  termchar *d_1;
  _Bool do_copy;
  _Bool break_run;
  unsigned_long tchar_1;
  unsigned_long tattr_1;
  wchar_t k;
  wchar_t colour;
  termchar *d;
  unsigned_long tchar;
  unsigned_long tattr;
  truecolour tc;
  wchar_t *backward;
  wchar_t local_98;
  _Bool dirtyrect;
  wchar_t laststart;
  wchar_t wStack_8c;
  _Bool last_run_dirty;
  wchar_t ccount;
  wchar_t start;
  unsigned_long cset;
  unsigned_long attr;
  _Bool selected;
  _Bool dirty_run;
  termchar *ptStack_70;
  _Bool dirty_line;
  termchar *lchars_1;
  termline *ldata_1;
  termchar *dispcurs;
  termchar *lchars;
  termline *ldata;
  termchar *newline;
  size_t chlen;
  wchar_t *ch;
  pos scrpos;
  wchar_t cursor;
  wchar_t rv;
  wchar_t our_curs_x;
  wchar_t our_curs_y;
  wchar_t j;
  wchar_t i;
  Terminal *term_local;
  
  newline = (termchar *)0x400;
  chlen = (size_t)safemalloc(0x400,4,0);
  ptr = safemalloc((long)term->cols,0x20,0);
  scrpos.x = L'\0';
  if (((term->rvideo ^ 0xffU) & 1) != ((term->in_vbell ^ 0xffU) & 1)) {
    scrpos.x = L'\x00100000';
  }
  if ((term->cursor_on & 1U) == 0) {
    scrpos.y = L'\0';
  }
  else {
    if ((term->has_focus & 1U) == 0) {
      scrpos.y = L'\x20000000';
    }
    else if (((term->cblinker & 1U) == 0) && ((term->blink_cur & 1U) != 0)) {
      scrpos.y = L'\0';
    }
    else {
      scrpos.y = L'\x40000000';
    }
    if ((term->wrapnext & 1U) != 0) {
      scrpos.y = scrpos.y | 0x10000000;
    }
  }
  scr_y = (term->curs).y - term->disptop;
  ptVar10 = lineptr(term,(term->curs).y,L'ᝀ',L'\0');
  cursor = (term->curs).x;
  dispcurs = term_bidi_line(term,ptVar10,scr_y);
  if (dispcurs == (termchar *)0x0) {
    dispcurs = ptVar10->chars;
  }
  else {
    cursor = term->post_bidi_cache[scr_y].forward[cursor];
  }
  if ((L'\0' < cursor) && (dispcurs[cursor].chr == 0xdfff)) {
    cursor = cursor + L'\xffffffff';
  }
  unlineptr(ptVar10);
  if ((L'\xffffffff' < term->dispcursy) &&
     (((term->curstype != scrpos.y || (term->dispcursy != scr_y)) || (term->dispcursx != cursor))))
  {
    ptVar11 = term->disptext[term->dispcursy]->chars + term->dispcursx;
    if ((L'\0' < term->dispcursx) && (ptVar11->chr == 0xdfff)) {
      ptVar11[-1].attr = ptVar11[-1].attr | 0x3ffff;
    }
    if ((term->dispcursx < term->cols + L'\xffffffff') && (ptVar11[1].chr == 0xdfff)) {
      ptVar11[1].attr = ptVar11[1].attr | 0x3ffff;
    }
    ptVar11->attr = ptVar11->attr | 0x3ffff;
    term->curstype = L'\0';
  }
  term->dispcursy = L'\xffffffff';
  term->dispcursx = L'\xffffffff';
  our_curs_y = L'\0';
  do {
    if (term->rows <= our_curs_y) {
      safefree(ptr);
      safefree((void *)chlen);
      return;
    }
    cset = 0;
    _ccount = 0;
    wStack_8c = L'\0';
    laststart = L'\0';
    bVar4 = false;
    ch._0_4_ = our_curs_y + term->disptop;
    ptVar10 = lineptr(term,(wchar_t)ch,L'᝶',L'\0');
    ptStack_70 = term_bidi_line(term,ptVar10,our_curs_y);
    if (ptStack_70 == (termchar *)0x0) {
      ptStack_70 = ptVar10->chars;
      tc.fg.enabled = false;
      tc.fg.r = '\0';
      tc.fg.g = '\0';
      tc.fg.b = '\0';
      tc.bg.enabled = false;
      tc.bg.r = '\0';
      tc.bg.g = '\0';
      tc.bg.b = '\0';
    }
    else {
      tc = (truecolour)term->post_bidi_cache[our_curs_y].backward;
    }
    for (our_curs_x = L'\0'; our_curs_x < term->cols; our_curs_x = our_curs_x + L'\x01') {
      ptVar11 = ptStack_70 + our_curs_x;
      if (tc == (truecolour)0x0) {
        local_104 = our_curs_x;
      }
      else {
        local_104 = *(wchar_t *)((long)tc + (long)our_curs_x * 4);
      }
      ch._4_4_ = local_104;
      d = (termchar *)ptVar11->chr;
      tchar = ptVar11->attr;
      if ((term->ansi_colour & 1U) == 0) {
        tchar = tchar & 0xfffc0000 | 0x20500;
      }
      if ((term->xterm_256_colour & 1U) == 0) {
        uVar8 = (uint)tchar & 0x1ff;
        if ((0xf < uVar8) && (uVar8 < 0x100)) {
          tchar = tchar & 0xfffffe00 | 0x100;
        }
        uVar8 = (uint)((tchar & 0x3fe00) >> 9);
        if ((0xf < uVar8) && (uVar8 < 0x100)) {
          tchar = tchar & 0xfffc01ff | 0x20400;
        }
      }
      if ((term->true_colour & 1U) == 0) {
        tattr = 0;
      }
      else {
        tattr = *(unsigned_long *)&ptVar11->truecolour;
      }
      uVar8 = (uint)d & 0xffffff00;
      if (uVar8 == 0xd800) {
        d = (termchar *)(long)term->ucsdata->unitab_line[(ulong)d & 0xff];
      }
      else if (uVar8 == 0xd900) {
        d = (termchar *)(long)term->ucsdata->unitab_xterm[(ulong)d & 0xff];
      }
      else if (uVar8 == 0xda00) {
        d = (termchar *)(long)term->ucsdata->unitab_scoacs[(ulong)d & 0xff];
      }
      if ((our_curs_x < term->cols + L'\xffffffff') && (ptVar11[1].chr == 0xdfff)) {
        tchar = tchar | 0x400000;
      }
      if ((term->selstate == DRAGGING) || (term->selstate == SEEN_OSC)) {
        if (term->seltype == LEXICOGRAPHIC) {
          p2.x = local_104;
          p2.y = (wchar_t)ch;
          _Var7 = posle(term->selstart,p2);
          local_111 = false;
          if (_Var7) {
            p1.x = ch._4_4_;
            p1.y = (wchar_t)ch;
            local_111 = poslt(p1,term->selend);
          }
          attr._5_1_ = local_111;
        }
        else {
          p2_00.x = local_104;
          p2_00.y = (wchar_t)ch;
          _Var7 = posPle(term->selstart,p2_00);
          local_112 = false;
          if (_Var7) {
            p1_00.x = ch._4_4_;
            p1_00.y = (wchar_t)ch;
            local_112 = posPle_left(p1_00,term->selend);
          }
          attr._5_1_ = local_112;
        }
      }
      else {
        attr._5_1_ = false;
      }
      uVar8 = 0;
      if (attr._5_1_ != false) {
        uVar8 = 0x100000;
      }
      tchar = tchar ^ (long)scrpos.x ^ (ulong)uVar8;
      if (((term->blink_is_real & 1U) != 0) && ((tchar & 0x200000) != 0)) {
        if (((term->has_focus & 1U) != 0) && ((term->tblinker & 1U) != 0)) {
          d = (termchar *)(long)term->ucsdata->unitab_line[0x20];
        }
        tchar = tchar & 0xffdfffff;
      }
      if ((d == (termchar *)term->disptext[our_curs_y]->chars[our_curs_x].chr) &&
         (tchar == (term->disptext[our_curs_y]->chars[our_curs_x].attr & 0xffffffff0f7fffff))) {
        if ((term->disptext[our_curs_y]->chars[our_curs_x].attr & 0x800000) != 0) {
          tchar = tchar | 0x800000;
        }
      }
      else if (((tchar & 0x400000) == 0) &&
              (wVar9 = win_char_width(term->win,(wchar_t)d), wVar9 == L'\x02')) {
        tchar = tchar | 0x800000;
      }
      if ((our_curs_y == scr_y) && (our_curs_x == cursor)) {
        tchar = (long)scrpos.y | tchar;
        term->curstype = scrpos.y;
        term->dispcursx = our_curs_x;
        term->dispcursy = our_curs_y;
      }
      *(unsigned_long *)((long)ptr + (long)our_curs_x * 0x20 + 8) = tchar;
      *(termchar **)((long)ptr + (long)our_curs_x * 0x20) = d;
      *(unsigned_long *)((long)ptr + (long)our_curs_x * 0x20 + 0x10) = tattr;
      *(undefined4 *)((long)ptr + (long)our_curs_x * 0x20 + 0x18) = 0;
    }
    local_98 = L'\0';
    bVar12 = false;
    for (our_curs_x = L'\0'; our_curs_x < term->cols; our_curs_x = our_curs_x + L'\x01') {
      if ((term->disptext[our_curs_y]->chars[our_curs_x].attr & 0x80000000) != 0) {
        local_98 = our_curs_x;
        bVar12 = false;
      }
      if (((term->disptext[our_curs_y]->chars[our_curs_x].chr !=
            *(unsigned_long *)((long)ptr + (long)our_curs_x * 0x20)) ||
          ((term->disptext[our_curs_y]->chars[our_curs_x].attr & 0xffffffff0fffffff) !=
           *(ulong *)((long)ptr + (long)our_curs_x * 0x20 + 8))) && (!bVar12)) {
        for (tattr_1._0_4_ = local_98; (wchar_t)tattr_1 < our_curs_x;
            tattr_1._0_4_ = (wchar_t)tattr_1 + L'\x01') {
          ptVar11 = term->disptext[our_curs_y]->chars;
          ptVar11[(wchar_t)tattr_1].attr = ptVar11[(wchar_t)tattr_1].attr | 0x3ffff;
        }
        bVar12 = true;
      }
      if (bVar12) {
        ptVar11 = term->disptext[our_curs_y]->chars;
        ptVar11[our_curs_x].attr = ptVar11[our_curs_x].attr | 0x3ffff;
      }
    }
    bVar12 = ptVar10->lattr != term->disptext[our_curs_y]->lattr;
    term->disptext[our_curs_y]->lattr = ptVar10->lattr;
    tattr = (unsigned_long)(term->erase_char).truecolour;
    bVar5 = bVar12;
    for (our_curs_x = L'\0'; our_curs_x < term->cols; our_curs_x = our_curs_x + L'\x01') {
      ptVar11 = ptStack_70 + our_curs_x;
      battr = *(ulong *)((long)ptr + (long)our_curs_x * 0x20 + 8);
      bchr = *(ulong *)((long)ptr + (long)our_curs_x * 0x20);
      if (((term->disptext[our_curs_y]->chars[our_curs_x].attr ^ battr) & 0x400000) != 0) {
        bVar5 = true;
      }
      bVar13 = ((battr ^ cset) & (long)term->attr_mask) != 0;
      if (((((*(byte *)((long)ptr + (long)our_curs_x * 0x20 + 0x10) & 1) != ((byte)tattr & 1)) ||
           (*(uchar *)((long)ptr + (long)our_curs_x * 0x20 + 0x11) != tattr._1_1_)) ||
          ((*(uchar *)((long)ptr + (long)our_curs_x * 0x20 + 0x12) != tattr._2_1_ ||
           ((*(uchar *)((long)ptr + (long)our_curs_x * 0x20 + 0x13) != tattr._3_1_ ||
            ((*(byte *)((long)ptr + (long)our_curs_x * 0x20 + 0x14) & 1) != (tattr._4_1_ & 1)))))))
         || ((*(uchar *)((long)ptr + (long)our_curs_x * 0x20 + 0x15) != tattr._5_1_ ||
             ((*(uchar *)((long)ptr + (long)our_curs_x * 0x20 + 0x16) != tattr._6_1_ ||
              (*(uchar *)((long)ptr + (long)our_curs_x * 0x20 + 0x17) != tattr._7_1_)))))) {
        bVar13 = true;
      }
      if (((bchr & 0xfffffc00) == 0xd800) || ((bchr & 0xfffffe00) == 0xdc00)) {
        local_120 = bchr & 0xffffff00;
      }
      else {
        local_120 = 0;
      }
      if (local_120 != _ccount) {
        bVar13 = true;
      }
      if ((ptVar11->cc_next != L'\0') || ((L'\0' < our_curs_x && (ptVar11[-1].cc_next != L'\0')))) {
        bVar13 = true;
      }
      if ((ptVar11->chr == 0xdffe) ||
         (((L'\x01' < our_curs_x && (ptVar11[-1].chr == 0xdfff)) && (ptVar11[-2].chr == 0xdffe)))) {
        bVar13 = true;
      }
      if (((term->ucsdata->dbcs_screenfont & 1U) == 0) && (!bVar5)) {
        if ((((term->disptext[our_curs_y]->chars[our_curs_x].chr == bchr) &&
             (((term->disptext[our_curs_y]->chars[our_curs_x].attr & 0xffffffff0fffffff) == battr &&
              ((term->disptext[our_curs_y]->chars[our_curs_x].truecolour.fg.enabled & 1U) ==
               ((byte)tattr & 1))))) &&
            (term->disptext[our_curs_y]->chars[our_curs_x].truecolour.fg.r == tattr._1_1_)) &&
           (((((term->disptext[our_curs_y]->chars[our_curs_x].truecolour.fg.g == tattr._2_1_ &&
               (term->disptext[our_curs_y]->chars[our_curs_x].truecolour.fg.b == tattr._3_1_)) &&
              ((term->disptext[our_curs_y]->chars[our_curs_x].truecolour.bg.enabled & 1U) ==
               (tattr._4_1_ & 1))) &&
             ((term->disptext[our_curs_y]->chars[our_curs_x].truecolour.bg.r == tattr._5_1_ &&
              (term->disptext[our_curs_y]->chars[our_curs_x].truecolour.bg.g == tattr._6_1_)))) &&
            (term->disptext[our_curs_y]->chars[our_curs_x].truecolour.bg.b == tattr._7_1_)))) {
          bVar13 = true;
        }
        else if ((!bVar12) && (laststart == L'\x01')) {
          bVar13 = true;
        }
      }
      bVar3 = bVar12;
      if (bVar13) {
        if (((bVar12) || (bVar4)) && (L'\0' < laststart)) {
          do_paint_draw(term,ptVar10,wStack_8c,our_curs_y,(wchar_t *)chlen,laststart,cset,
                        (truecolour)tattr);
        }
        wStack_8c = our_curs_x;
        laststart = L'\0';
        tattr = *(unsigned_long *)((long)ptr + (long)our_curs_x * 0x20 + 0x10);
        if (((bchr & 0xfffffc00) == 0xd800) || ((bchr & 0xfffffe00) == 0xdc00)) {
          local_128 = bchr & 0xffffff00;
        }
        else {
          local_128 = 0;
        }
        _ccount = local_128;
        cset = battr;
        bVar3 = bVar5;
        if ((term->ucsdata->dbcs_screenfont & 1U) != 0) {
          bVar4 = bVar12;
        }
      }
      uVar6 = tattr;
      _Var7 = termchars_equal_override
                        (term->disptext[our_curs_y]->chars + our_curs_x,ptVar11,bchr,battr);
      if (!_Var7) {
        bVar3 = true;
      }
      chlen = (size_t)safegrowarray((void *)chlen,(size_t *)&newline,4,(long)laststart,2,false);
      wVar9 = laststart + L'\x01';
      *(int *)(chlen + (long)laststart * 4) = (int)bchr;
      schar = (unsigned_long)ptVar11;
      laststart = wVar9;
      if (ptVar11->cc_next != L'\0') {
        while (*(int *)(schar + 0x18) != 0) {
          schar = schar + (long)*(int *)(schar + 0x18) * 0x20;
          uVar1 = *(ulong *)schar;
          local_100 = (wchar_t)uVar1;
          uVar8 = local_100 & 0xffffff00;
          if (uVar8 == 0xd800) {
            local_100 = term->ucsdata->unitab_line[uVar1 & 0xff];
          }
          else if (uVar8 == 0xd900) {
            local_100 = term->ucsdata->unitab_xterm[uVar1 & 0xff];
          }
          else if (uVar8 == 0xda00) {
            local_100 = term->ucsdata->unitab_scoacs[uVar1 & 0xff];
          }
          chlen = (size_t)safegrowarray((void *)chlen,(size_t *)&newline,4,(long)laststart,2,false);
          *(wchar_t *)(chlen + (long)laststart * 4) = local_100;
          laststart = laststart + L'\x01';
        }
        cset = cset | 0x80000000;
      }
      if (!_Var7) {
        copy_termchar(term->disptext[our_curs_y],our_curs_x,ptVar11);
        term->disptext[our_curs_y]->chars[our_curs_x].chr = bchr;
        term->disptext[our_curs_y]->chars[our_curs_x].attr = battr;
        ptVar2 = term->disptext[our_curs_y]->chars + our_curs_x;
        (ptVar2->truecolour).fg.enabled = (_Bool)(byte)tattr;
        (ptVar2->truecolour).fg.r = tattr._1_1_;
        (ptVar2->truecolour).fg.g = tattr._2_1_;
        (ptVar2->truecolour).fg.b = tattr._3_1_;
        (ptVar2->truecolour).bg.enabled = (_Bool)tattr._4_1_;
        (ptVar2->truecolour).bg.r = tattr._5_1_;
        (ptVar2->truecolour).bg.g = tattr._6_1_;
        (ptVar2->truecolour).bg.b = tattr._7_1_;
        if (wStack_8c == our_curs_x) {
          ptVar2 = term->disptext[our_curs_y]->chars;
          ptVar2[our_curs_x].attr = ptVar2[our_curs_x].attr | 0x80000000;
        }
      }
      bVar12 = bVar3;
      if (((battr & 0x400000) != 0) && (our_curs_x = our_curs_x + L'\x01', our_curs_x < term->cols))
      {
        if ((our_curs_y == scr_y) && (our_curs_x == cursor)) {
          __assert_fail("!(i == our_curs_y && j == our_curs_x)",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x189a,"void do_paint(Terminal *)");
        }
        _Var7 = termchars_equal(term->disptext[our_curs_y]->chars + our_curs_x,ptVar11 + 1);
        if (!_Var7) {
          bVar3 = true;
        }
        copy_termchar(term->disptext[our_curs_y],our_curs_x,ptVar11 + 1);
        bVar12 = bVar3;
      }
      tattr = uVar6;
    }
    if ((bVar12) && (L'\0' < laststart)) {
      do_paint_draw(term,ptVar10,wStack_8c,our_curs_y,(wchar_t *)chlen,laststart,cset,
                    (truecolour)tattr);
    }
    unlineptr(ptVar10);
    our_curs_y = our_curs_y + L'\x01';
  } while( true );
}

Assistant:

static void do_paint(Terminal *term)
{
    int i, j, our_curs_y, our_curs_x;
    int rv, cursor;
    pos scrpos;
    wchar_t *ch;
    size_t chlen;
    termchar *newline;

    chlen = 1024;
    ch = snewn(chlen, wchar_t);

    newline = snewn(term->cols, termchar);

    rv = (!term->rvideo ^ !term->in_vbell ? ATTR_REVERSE : 0);

    /* Depends on:
     * screen array, disptop, scrtop,
     * selection, rv,
     * blinkpc, blink_is_real, tblinker,
     * curs.y, curs.x, cblinker, blink_cur, cursor_on, has_focus, wrapnext
     */

    /* Has the cursor position or type changed ? */
    if (term->cursor_on) {
        if (term->has_focus) {
            if (term->cblinker || !term->blink_cur)
                cursor = TATTR_ACTCURS;
            else
                cursor = 0;
        } else
            cursor = TATTR_PASCURS;
        if (term->wrapnext)
            cursor |= TATTR_RIGHTCURS;
    } else
        cursor = 0;
    our_curs_y = term->curs.y - term->disptop;
    {
        /*
         * Adjust the cursor position:
         *  - for bidi
         *  - in the case where it's resting on the right-hand half
         *    of a CJK wide character. xterm's behaviour here,
         *    which seems adequate to me, is to display the cursor
         *    covering the _whole_ character, exactly as if it were
         *    one space to the left.
         */
        termline *ldata = lineptr(term->curs.y);
        termchar *lchars;

        our_curs_x = term->curs.x;

        if ( (lchars = term_bidi_line(term, ldata, our_curs_y)) != NULL) {
            our_curs_x = term->post_bidi_cache[our_curs_y].forward[our_curs_x];
        } else
            lchars = ldata->chars;

        if (our_curs_x > 0 &&
            lchars[our_curs_x].chr == UCSWIDE)
            our_curs_x--;

        unlineptr(ldata);
    }

    /*
     * If the cursor is not where it was last time we painted, and
     * its previous position is visible on screen, invalidate its
     * previous position.
     */
    if (term->dispcursy >= 0 &&
        (term->curstype != cursor ||
         term->dispcursy != our_curs_y ||
         term->dispcursx != our_curs_x)) {
        termchar *dispcurs = term->disptext[term->dispcursy]->chars +
            term->dispcursx;

        if (term->dispcursx > 0 && dispcurs->chr == UCSWIDE)
            dispcurs[-1].attr |= ATTR_INVALID;
        if (term->dispcursx < term->cols-1 && dispcurs[1].chr == UCSWIDE)
            dispcurs[1].attr |= ATTR_INVALID;
        dispcurs->attr |= ATTR_INVALID;

        term->curstype = 0;
    }
    term->dispcursx = term->dispcursy = -1;

    /* The normal screen data */
    for (i = 0; i < term->rows; i++) {
        termline *ldata;
        termchar *lchars;
        bool dirty_line, dirty_run, selected;
        unsigned long attr = 0, cset = 0;
        int start = 0;
        int ccount = 0;
        bool last_run_dirty = false;
        int laststart;
        bool dirtyrect;
        int *backward;
        truecolour tc;

        scrpos.y = i + term->disptop;
        ldata = lineptr(scrpos.y);

        /* Do Arabic shaping and bidi. */
        lchars = term_bidi_line(term, ldata, i);
        if (lchars) {
            backward = term->post_bidi_cache[i].backward;
        } else {
            lchars = ldata->chars;
            backward = NULL;
        }

        /*
         * First loop: work along the line deciding what we want
         * each character cell to look like.
         */
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            termchar *d = lchars + j;
            scrpos.x = backward ? backward[j] : j;

            tchar = d->chr;
            tattr = d->attr;

            if (!term->ansi_colour)
                tattr = (tattr & ~(ATTR_FGMASK | ATTR_BGMASK)) |
                ATTR_DEFFG | ATTR_DEFBG;

            if (!term->xterm_256_colour) {
                int colour;
                colour = (tattr & ATTR_FGMASK) >> ATTR_FGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_FGMASK) | ATTR_DEFFG;
                colour = (tattr & ATTR_BGMASK) >> ATTR_BGSHIFT;
                if (colour >= 16 && colour < 256)
                    tattr = (tattr &~ ATTR_BGMASK) | ATTR_DEFBG;
            }

            if (term->true_colour) {
                tc = d->truecolour;
            } else {
                tc.fg = tc.bg = optionalrgb_none;
            }

            switch (tchar & CSET_MASK) {
              case CSET_ASCII:
                tchar = term->ucsdata->unitab_line[tchar & 0xFF];
                break;
              case CSET_LINEDRW:
                tchar = term->ucsdata->unitab_xterm[tchar & 0xFF];
                break;
              case CSET_SCOACS:
                tchar = term->ucsdata->unitab_scoacs[tchar&0xFF];
                break;
            }
            if (j < term->cols-1 && d[1].chr == UCSWIDE)
                tattr |= ATTR_WIDE;

            /* Video reversing things */
            if (term->selstate == DRAGGING || term->selstate == SELECTED) {
                if (term->seltype == LEXICOGRAPHIC)
                    selected = (posle(term->selstart, scrpos) &&
                                poslt(scrpos, term->selend));
                else
                    selected = (posPle(term->selstart, scrpos) &&
                                posPle_left(scrpos, term->selend));
            } else
                selected = false;
            tattr = (tattr ^ rv
                     ^ (selected ? ATTR_REVERSE : 0));

            /* 'Real' blinking ? */
            if (term->blink_is_real && (tattr & ATTR_BLINK)) {
                if (term->has_focus && term->tblinker) {
                    tchar = term->ucsdata->unitab_line[(unsigned char)' '];
                }
                tattr &= ~ATTR_BLINK;
            }

            /*
             * Check the font we'll _probably_ be using to see if
             * the character is wide when we don't want it to be.
             */
            if (tchar != term->disptext[i]->chars[j].chr ||
                tattr != (term->disptext[i]->chars[j].attr &~
                          (ATTR_NARROW | DATTR_MASK))) {
                if ((tattr & ATTR_WIDE) == 0 &&
                    win_char_width(term->win, tchar) == 2)
                    tattr |= ATTR_NARROW;
            } else if (term->disptext[i]->chars[j].attr & ATTR_NARROW)
                tattr |= ATTR_NARROW;

            if (i == our_curs_y && j == our_curs_x) {
                tattr |= cursor;
                term->curstype = cursor;
                term->dispcursx = j;
                term->dispcursy = i;
            }

            /* FULL-TERMCHAR */
            newline[j].attr = tattr;
            newline[j].chr = tchar;
            newline[j].truecolour = tc;
            /* Combining characters are still read from lchars */
            newline[j].cc_next = 0;
        }

        /*
         * Now loop over the line again, noting where things have
         * changed.
         *
         * During this loop, we keep track of where we last saw
         * DATTR_STARTRUN. Any mismatch automatically invalidates
         * _all_ of the containing run that was last printed: that
         * is, any rectangle that was drawn in one go in the
         * previous update should be either left completely alone
         * or overwritten in its entirety. This, along with the
         * expectation that front ends clip all text runs to their
         * bounding rectangle, should solve any possible problems
         * with fonts that overflow their character cells.
         */
        laststart = 0;
        dirtyrect = false;
        for (j = 0; j < term->cols; j++) {
            if (term->disptext[i]->chars[j].attr & DATTR_STARTRUN) {
                laststart = j;
                dirtyrect = false;
            }

            if (term->disptext[i]->chars[j].chr != newline[j].chr ||
                (term->disptext[i]->chars[j].attr &~ DATTR_MASK)
                != newline[j].attr) {
                int k;

                if (!dirtyrect) {
                    for (k = laststart; k < j; k++)
                        term->disptext[i]->chars[k].attr |= ATTR_INVALID;

                    dirtyrect = true;
                }
            }

            if (dirtyrect)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        }

        /*
         * Finally, loop once more and actually do the drawing.
         */
        dirty_run = dirty_line = (ldata->lattr !=
                                  term->disptext[i]->lattr);
        term->disptext[i]->lattr = ldata->lattr;

        tc = term->erase_char.truecolour;
        for (j = 0; j < term->cols; j++) {
            unsigned long tattr, tchar;
            bool break_run, do_copy;
            termchar *d = lchars + j;

            tattr = newline[j].attr;
            tchar = newline[j].chr;

            if ((term->disptext[i]->chars[j].attr ^ tattr) & ATTR_WIDE)
                dirty_line = true;

            break_run = ((tattr ^ attr) & term->attr_mask) != 0;

            if (!truecolour_equal(newline[j].truecolour, tc))
                break_run = true;

#ifdef USES_VTLINE_HACK
            /* Special hack for VT100 Linedraw glyphs */
            if ((tchar >= 0x23BA && tchar <= 0x23BD) ||
                (j > 0 && (newline[j-1].chr >= 0x23BA &&
                           newline[j-1].chr <= 0x23BD)))
                break_run = true;
#endif

            /*
             * Separate out sequences of characters that have the
             * same CSET, if that CSET is a magic one.
             */
            if (CSET_OF(tchar) != cset)
                break_run = true;

            /*
             * Break on both sides of any combined-character cell.
             */
            if (d->cc_next != 0 ||
                (j > 0 && d[-1].cc_next != 0))
                break_run = true;

            /*
             * Break on both sides of a trust sigil.
             */
            if (d->chr == TRUST_SIGIL_CHAR ||
                (j >= 2 && d[-1].chr == UCSWIDE &&
                 d[-2].chr == TRUST_SIGIL_CHAR))
                break_run = true;

            if (!term->ucsdata->dbcs_screenfont && !dirty_line) {
                if (term->disptext[i]->chars[j].chr == tchar &&
                    (term->disptext[i]->chars[j].attr &~ DATTR_MASK)==tattr &&
                    truecolour_equal(
                        term->disptext[i]->chars[j].truecolour, tc))
                    break_run = true;
                else if (!dirty_run && ccount == 1)
                    break_run = true;
            }

            if (break_run) {
                if ((dirty_run || last_run_dirty) && ccount > 0)
                    do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);
                start = j;
                ccount = 0;
                attr = tattr;
                tc = newline[j].truecolour;
                cset = CSET_OF(tchar);
                if (term->ucsdata->dbcs_screenfont)
                    last_run_dirty = dirty_run;
                dirty_run = dirty_line;
            }

            do_copy = false;
            if (!termchars_equal_override(&term->disptext[i]->chars[j],
                                          d, tchar, tattr)) {
                do_copy = true;
                dirty_run = true;
            }

            sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
            if (tchar > 0x10000 && tchar < 0x110000) {
                ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(tchar);
                ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(tchar);
            } else
#endif /* PLATFORM_IS_UTF16 */
            ch[ccount++] = (wchar_t) tchar;

            if (d->cc_next) {
                termchar *dd = d;

                while (dd->cc_next) {
                    unsigned long schar;

                    dd += dd->cc_next;

                    schar = dd->chr;
                    switch (schar & CSET_MASK) {
                      case CSET_ASCII:
                        schar = term->ucsdata->unitab_line[schar & 0xFF];
                        break;
                      case CSET_LINEDRW:
                        schar = term->ucsdata->unitab_xterm[schar & 0xFF];
                        break;
                      case CSET_SCOACS:
                        schar = term->ucsdata->unitab_scoacs[schar&0xFF];
                        break;
                    }

                    sgrowarrayn(ch, chlen, ccount, 2);

#ifdef PLATFORM_IS_UTF16
                    if (schar > 0x10000 && schar < 0x110000) {
                        ch[ccount++] = (wchar_t) HIGH_SURROGATE_OF(schar);
                        ch[ccount++] = (wchar_t) LOW_SURROGATE_OF(schar);
                    } else
#endif /* PLATFORM_IS_UTF16 */
                    ch[ccount++] = (wchar_t) schar;
                }

                attr |= TATTR_COMBINING;
            }

            if (do_copy) {
                copy_termchar(term->disptext[i], j, d);
                term->disptext[i]->chars[j].chr = tchar;
                term->disptext[i]->chars[j].attr = tattr;
                term->disptext[i]->chars[j].truecolour = tc;
                if (start == j)
                    term->disptext[i]->chars[j].attr |= DATTR_STARTRUN;
            }

            /* If it's a wide char step along to the next one. */
            if (tattr & ATTR_WIDE) {
                if (++j < term->cols) {
                    d++;
                    /*
                     * By construction above, the cursor should not
                     * be on the right-hand half of this character.
                     * Ever.
                     */
                    assert(!(i == our_curs_y && j == our_curs_x));
                    if (!termchars_equal(&term->disptext[i]->chars[j], d))
                        dirty_run = true;
                    copy_termchar(term->disptext[i], j, d);
                }
            }
        }
        if (dirty_run && ccount > 0)
            do_paint_draw(term, ldata, start, i, ch, ccount, attr, tc);

        unlineptr(ldata);
    }

    sfree(newline);
    sfree(ch);
}